

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitfromevents.cpp
# Opt level: O0

void __thiscall
YAML::EmitFromEvents::OnMapStart
          (EmitFromEvents *this,Mark *param_2,string *tag,anchor_t anchor,value style)

{
  value_type *in_RDI;
  int in_R8D;
  anchor_t in_stack_00000080;
  string *in_stack_00000088;
  EmitFromEvents *in_stack_00000090;
  EMITTER_MANIP value;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  BeginNode((EmitFromEvents *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  EmitProps(in_stack_00000090,in_stack_00000088,in_stack_00000080);
  value = (EMITTER_MANIP)((ulong)in_RDI >> 0x20);
  if (in_R8D == 1) {
    YAML::operator<<((Emitter *)CONCAT44(1,in_stack_ffffffffffffffd0),value);
  }
  else if (in_R8D == 2) {
    YAML::operator<<((Emitter *)CONCAT44(2,in_stack_ffffffffffffffd0),value);
  }
  Emitter::RestoreGlobalModifiedSettings((Emitter *)0xef583f);
  YAML::operator<<((Emitter *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),
                   (EMITTER_MANIP)((ulong)in_RDI >> 0x20));
  std::
  stack<YAML::EmitFromEvents::State::value,_std::deque<YAML::EmitFromEvents::State::value,_std::allocator<YAML::EmitFromEvents::State::value>_>_>
  ::push((stack<YAML::EmitFromEvents::State::value,_std::deque<YAML::EmitFromEvents::State::value,_std::allocator<YAML::EmitFromEvents::State::value>_>_>
          *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),in_RDI);
  return;
}

Assistant:

void EmitFromEvents::OnMapStart(const Mark&, const std::string& tag,
                                anchor_t anchor, EmitterStyle::value style) {
  BeginNode();
  EmitProps(tag, anchor);
  switch (style) {
    case EmitterStyle::Block:
      m_emitter << Block;
      break;
    case EmitterStyle::Flow:
      m_emitter << Flow;
      break;
    default:
      break;
  }
  // Restore the global settings to eliminate the override from node style
  m_emitter.RestoreGlobalModifiedSettings();
  m_emitter << BeginMap;
  m_stateStack.push(State::WaitingForKey);
}